

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O3

void Gudhi::persistence_matrix::swap
               (List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                *col1,List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                      *col2)

{
  Dimension DVar1;
  ID_index IVar2;
  Index IVar3;
  size_t sVar4;
  Field_operators *pFVar5;
  Entry_constructor *pEVar6;
  
  DVar1 = (col1->super_Column_dimension_option).dim_;
  (col1->super_Column_dimension_option).dim_ = (col2->super_Column_dimension_option).dim_;
  (col2->super_Column_dimension_option).dim_ = DVar1;
  IVar2 = (col1->super_Chain_column_option).pivot_;
  (col1->super_Chain_column_option).pivot_ = (col2->super_Chain_column_option).pivot_;
  (col2->super_Chain_column_option).pivot_ = IVar2;
  IVar3 = (col1->super_Chain_column_option).pairedColumn_;
  (col1->super_Chain_column_option).pairedColumn_ = (col2->super_Chain_column_option).pairedColumn_;
  (col2->super_Chain_column_option).pairedColumn_ = IVar3;
  std::__detail::_List_node_base::swap
            ((_List_node_base *)&col1->column_,(_List_node_base *)&col2->column_);
  sVar4 = (col2->column_).
          super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
          ._M_impl._M_node._M_size;
  (col2->column_).
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
  ._M_impl._M_node._M_size =
       (col1->column_).
       super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
       ._M_impl._M_node._M_size;
  (col1->column_).
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
  ._M_impl._M_node._M_size = sVar4;
  pFVar5 = col1->operators_;
  col1->operators_ = col2->operators_;
  col2->operators_ = pFVar5;
  pEVar6 = col1->entryPool_;
  col1->entryPool_ = col2->entryPool_;
  col2->entryPool_ = pEVar6;
  return;
}

Assistant:

void swap(List_column& col1, List_column& col2) {
    swap(static_cast<typename Master_matrix::Row_access_option&>(col1),
         static_cast<typename Master_matrix::Row_access_option&>(col2));
    swap(static_cast<typename Master_matrix::Column_dimension_option&>(col1),
         static_cast<typename Master_matrix::Column_dimension_option&>(col2));
    swap(static_cast<typename Master_matrix::Chain_column_option&>(col1),
         static_cast<typename Master_matrix::Chain_column_option&>(col2));
    col1.column_.swap(col2.column_);
    std::swap(col1.operators_, col2.operators_);
    std::swap(col1.entryPool_, col2.entryPool_);
  }